

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_scriptpubkey_get_type(uchar *bytes,size_t bytes_len,size_t *written)

{
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  char cVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  ulong bytes_len_00;
  uchar *bytes_00;
  size_t n_op;
  size_t local_48;
  size_t local_40;
  undefined8 local_38;
  
  if (written == (size_t *)0x0) {
    return -2;
  }
  *written = 0;
  if (bytes_len == 0 || bytes == (uchar *)0x0) {
    return -2;
  }
  uVar1 = *bytes;
  uVar5 = CONCAT71((int7)((ulong)written >> 8),uVar1);
  if (uVar1 == 'j') {
    iVar2 = get_push_size(bytes + 1,bytes_len - 1,true,&local_40);
    if (((iVar2 == 0) &&
        (iVar2 = get_push_size(bytes + 1,bytes_len - 1,false,&local_48), iVar2 == 0)) &&
       (sVar3 = 1, local_40 + local_48 + 1 == bytes_len)) goto LAB_004acc3e;
  }
  else if (((((byte)(uVar1 + 0xaf) < 0x10 && 0x24 < bytes_len) && (bytes[bytes_len - 1] == 0xae)) &&
           ((byte)(bytes[bytes_len - 2] + 0xaf) < 0x10)) &&
          (uVar6 = bytes[bytes_len - 2] - 0x50, uVar7 = (ulong)uVar6, uVar6 != 0)) {
    bytes_len_00 = bytes_len - 1;
    bytes_00 = bytes + 1;
    local_38 = uVar5;
    do {
      iVar2 = get_push_size(bytes_00,bytes_len_00,true,&local_40);
      uVar5 = local_38;
      if ((((iVar2 != 0) ||
           (iVar2 = get_push_size(bytes_00,bytes_len_00,false,&local_48), uVar5 = local_38,
           iVar2 != 0)) || ((local_48 != 0x41 && (local_48 != 0x21)))) ||
         (bytes_len_00 < local_40 + local_48 + 2)) goto LAB_004acbba;
      bytes_00 = bytes_00 + local_40 + local_48;
      bytes_len_00 = bytes_len_00 - (local_40 + local_48);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    sVar3 = 0x20;
    if (bytes_len_00 == 2) goto LAB_004acc3e;
  }
LAB_004acbba:
  cVar4 = (char)uVar5;
  if ((long)bytes_len < 0x19) {
    if (bytes_len == 0x16) {
      if (cVar4 != '\0') {
        return 0;
      }
      sVar3 = 8;
      if (bytes[1] != '\x14') {
        return 0;
      }
    }
    else {
      if (bytes_len != 0x17) {
        return 0;
      }
      if (cVar4 != -0x57) {
        return 0;
      }
      if (bytes[1] != '\x14') {
        return 0;
      }
      sVar3 = 4;
      if (bytes[0x16] != 0x87) {
        return 0;
      }
    }
  }
  else if (bytes_len == 0x22) {
    if (cVar4 != '\0') {
      return 0;
    }
    sVar3 = 0x10;
    if (bytes[1] != ' ') {
      return 0;
    }
  }
  else {
    if (bytes_len != 0x19) {
      return 0;
    }
    if (cVar4 != 'v') {
      return 0;
    }
    if (bytes[1] != 0xa9) {
      return 0;
    }
    if (bytes[2] != '\x14') {
      return 0;
    }
    if (bytes[0x17] != 0x88) {
      return 0;
    }
    sVar3 = 2;
    if (bytes[0x18] != 0xac) {
      return 0;
    }
  }
LAB_004acc3e:
  *written = sVar3;
  return 0;
}

Assistant:

int wally_scriptpubkey_get_type(const unsigned char *bytes, size_t bytes_len,
                                size_t *written)
{
    if (written)
        *written = WALLY_SCRIPT_TYPE_UNKNOWN;

    if (!bytes || !bytes_len || !written)
        return WALLY_EINVAL;

    if (scriptpubkey_is_op_return(bytes, bytes_len)) {
        *written = WALLY_SCRIPT_TYPE_OP_RETURN;
        return WALLY_OK;
    }

    if (scriptpubkey_is_multisig(bytes, bytes_len)) {
        *written = WALLY_SCRIPT_TYPE_MULTISIG;
        return WALLY_OK;
    }

    switch (bytes_len) {
    case WALLY_SCRIPTPUBKEY_P2PKH_LEN:
        if (scriptpubkey_is_p2pkh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2PKH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2SH_LEN:
        if (scriptpubkey_is_p2sh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2SH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2WPKH_LEN:
        if (scriptpubkey_is_p2wpkh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2WPKH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2WSH_LEN:
        if (scriptpubkey_is_p2wsh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2WSH;
            return WALLY_OK;
        }
        break;
    }
    return WALLY_OK;
}